

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O3

void anon_unknown.dwarf_29ca355::PrepBuffers<unsigned_char>
               (ACMRandom *rnd,int w,int h,int stride,int bd,bool trash_edges,uchar *data)

{
  byte bVar1;
  uint32_t uVar2;
  uchar *puVar3;
  ulong uVar4;
  size_t __n;
  uchar *puVar5;
  long lVar6;
  uchar *puVar7;
  int i;
  long lVar8;
  ulong uVar9;
  
  FillEdge<unsigned_char>(rnd,stride << 5,bd,trash_edges,data);
  if (0 < h) {
    bVar1 = ~(byte)(-1 << ((byte)bd & 0x1f));
    lVar6 = (long)stride;
    puVar5 = data + lVar6 * 0x20;
    puVar7 = data + lVar6 * 0x20 + (long)w + 0x20;
    uVar4 = 0;
    do {
      puVar3 = data + (uVar4 + 0x20) * lVar6;
      if (trash_edges) {
        lVar8 = 0;
        do {
          uVar2 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar5[lVar8] = (byte)(uVar2 >> 0xf) & bVar1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x20);
      }
      else {
        puVar3[0x10] = '\0';
        puVar3[0x11] = '\0';
        puVar3[0x12] = '\0';
        puVar3[0x13] = '\0';
        puVar3[0x14] = '\0';
        puVar3[0x15] = '\0';
        puVar3[0x16] = '\0';
        puVar3[0x17] = '\0';
        puVar3[0x18] = '\0';
        puVar3[0x19] = '\0';
        puVar3[0x1a] = '\0';
        puVar3[0x1b] = '\0';
        puVar3[0x1c] = '\0';
        puVar3[0x1d] = '\0';
        puVar3[0x1e] = '\0';
        puVar3[0x1f] = '\0';
        puVar3[0] = '\0';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        puVar3[4] = '\0';
        puVar3[5] = '\0';
        puVar3[6] = '\0';
        puVar3[7] = '\0';
        puVar3[8] = '\0';
        puVar3[9] = '\0';
        puVar3[10] = '\0';
        puVar3[0xb] = '\0';
        puVar3[0xc] = '\0';
        puVar3[0xd] = '\0';
        puVar3[0xe] = '\0';
        puVar3[0xf] = '\0';
      }
      if (0 < w) {
        uVar9 = 0;
        do {
          uVar2 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar5[uVar9 + 0x20] = (byte)(uVar2 >> 0xf) & bVar1;
          uVar9 = uVar9 + 1;
        } while ((uint)w != uVar9);
      }
      if (trash_edges) {
        lVar8 = 0;
        do {
          uVar2 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar7[lVar8] = (byte)(uVar2 >> 0xf) & bVar1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x20);
      }
      else {
        puVar3 = puVar3 + (long)w + 0x20;
        puVar3[0x10] = '\0';
        puVar3[0x11] = '\0';
        puVar3[0x12] = '\0';
        puVar3[0x13] = '\0';
        puVar3[0x14] = '\0';
        puVar3[0x15] = '\0';
        puVar3[0x16] = '\0';
        puVar3[0x17] = '\0';
        puVar3[0x18] = '\0';
        puVar3[0x19] = '\0';
        puVar3[0x1a] = '\0';
        puVar3[0x1b] = '\0';
        puVar3[0x1c] = '\0';
        puVar3[0x1d] = '\0';
        puVar3[0x1e] = '\0';
        puVar3[0x1f] = '\0';
        puVar3[0] = '\0';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        puVar3[4] = '\0';
        puVar3[5] = '\0';
        puVar3[6] = '\0';
        puVar3[7] = '\0';
        puVar3[8] = '\0';
        puVar3[9] = '\0';
        puVar3[10] = '\0';
        puVar3[0xb] = '\0';
        puVar3[0xc] = '\0';
        puVar3[0xd] = '\0';
        puVar3[0xe] = '\0';
        puVar3[0xf] = '\0';
      }
      uVar4 = uVar4 + 1;
      puVar5 = puVar5 + lVar6;
      puVar7 = puVar7 + lVar6;
    } while (uVar4 != (uint)h);
  }
  FillEdge<unsigned_char>(rnd,stride << 5,bd,trash_edges,data + (h + 0x20) * stride);
  __n = (size_t)((h + 0x40) * stride);
  memcpy(data + __n,data,__n);
  return;
}

Assistant:

void PrepBuffers(ACMRandom *rnd, int w, int h, int stride, int bd,
                 bool trash_edges, Pixel *data) {
  assert(rnd);
  const Pixel mask = (1 << bd) - 1;

  // Fill in the first buffer with random data
  // Top border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data);
  for (int r = 0; r < h; ++r) {
    Pixel *row_data = data + (kVPad + r) * stride;
    // Left border, contents, right border
    FillEdge(rnd, kHPad, bd, trash_edges, row_data);
    for (int c = 0; c < w; ++c) row_data[kHPad + c] = rnd->Rand16() & mask;
    FillEdge(rnd, kHPad, bd, trash_edges, row_data + kHPad + w);
  }
  // Bottom border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data + stride * (kVPad + h));

  const int bpp = sizeof(*data);
  const int block_elts = stride * (h + 2 * kVPad);
  const int block_size = bpp * block_elts;

  // Now copy that to the second buffer
  memcpy(data + block_elts, data, block_size);
}